

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O2

CheckStreamRez * __thiscall
MPEG2StreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,MPEG2StreamReader *this,uint8_t *buffer,int len)

{
  MPEGSequenceHeader *this_00;
  uint8_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  byte bVar5;
  bool bVar6;
  uint8_t *end;
  byte bVar7;
  BitStreamReader bitReader;
  string local_d0;
  MPEGPictureHeader frame;
  
  CheckStreamRez::CheckStreamRez(__return_storage_ptr__);
  bitReader.super_BitStream.m_totalBits = 0;
  bitReader.super_BitStream.m_buffer = (uint *)0x0;
  bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  bitReader.m_curVal = 0;
  bitReader.m_bitLeft = 0;
  MPEGPictureHeader::MPEGPictureHeader(&frame,0);
  end = buffer + len;
  puVar3 = MPEGHeader::findNextMarker(buffer,end);
  this_00 = &this->m_sequence;
  bVar7 = 0;
  bVar5 = 0;
  bVar6 = false;
  do {
    if (end + -0x20 < puVar3) {
      if ((bVar5 & this->spsFound & bVar7) == 1) {
        CodecInfo::operator=(&__return_storage_ptr__->codecInfo,&::mpeg2CodecInfo);
        MPEGSequenceHeader::getStreamDescr_abi_cxx11_(&local_d0,this_00);
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->streamDescr,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        if (bVar6) {
          std::__cxx11::string::append((char *)&__return_storage_ptr__->streamDescr);
        }
      }
      MPEGRawDataHeader::~MPEGRawDataHeader(&frame.super_MPEGRawDataHeader);
      return __return_storage_ptr__;
    }
    uVar1 = puVar3[3];
    if ((byte)(uVar1 - 1) < 0xaf) {
      bVar7 = 1;
    }
    else {
      switch(uVar1) {
      case 0xb2:
      case 0xb7:
      case 0xb8:
        break;
      case 0xb3:
        puVar4 = MPEGHeader::findNextMarker(puVar3 + 4,end);
        puVar4 = MPEGSequenceHeader::deserialize
                           (this_00,puVar3 + 4,(int64_t)(puVar4 + (-4 - (long)puVar3)));
        if (puVar4 == (uint8_t *)0x0) goto switchD_001c6c93_caseD_b4;
        (this->super_MPEGStreamReader).m_streamAR = (uint)(this->m_sequence).aspect_ratio_info;
        this->spsFound = true;
        break;
      case 0xb4:
      case 0xb6:
switchD_001c6c93_caseD_b4:
        MPEGRawDataHeader::~MPEGRawDataHeader(&frame.super_MPEGRawDataHeader);
        return __return_storage_ptr__;
      case 0xb5:
        BitStreamReader::setBuffer(&bitReader,puVar3 + 4,end);
        uVar2 = BitStreamReader::getBits(&bitReader,4);
        if ((char)uVar2 == '\b') {
          MPEGPictureHeader::deserializeCodingExtension(&frame,&bitReader);
          bVar6 = (bool)(bVar6 | frame.repeat_first_field != '\0');
        }
        else if ((uVar2 & 0xff) == 1) {
          MPEGSequenceHeader::deserializeExtension(this_00,&bitReader);
        }
        break;
      default:
        if (uVar1 != '\0') goto switchD_001c6c93_caseD_b4;
        puVar4 = MPEGPictureHeader::deserialize
                           (&frame,puVar3 + 4,(int64_t)(end + (-4 - (long)puVar3)));
        bVar5 = 1;
        if (puVar4 == (uint8_t *)0x0) goto switchD_001c6c93_caseD_b4;
      }
    }
    puVar3 = MPEGHeader::findNextMarker(puVar3 + 4,end);
  } while( true );
}

Assistant:

CheckStreamRez MPEG2StreamReader::checkStream(uint8_t* buffer, int len)
{
    CheckStreamRez rez;
    uint8_t* end = buffer + len;
    BitStreamReader bitReader{};
    uint8_t* nextNal = nullptr;
    bool sliceFound = false;
    bool pictureFound = false;
    bool pulldownFound = false;
    uint8_t extType = 0;
    MPEGPictureHeader frame(0);
    for (uint8_t* nal = MPEGHeader::findNextMarker(buffer, end); nal <= end - 32;
         nal = MPEGHeader::findNextMarker(nal + 4, end))
    {
        uint8_t unitType = nal[3];
        try
        {
            if (unitType >= SLICE_MIN_START_SHORT_CODE && unitType <= SLICE_MAX_START_SHORT_CODE)
                sliceFound = true;
            else
                switch (unitType)
                {
                case EXT_START_SHORT_CODE:
                    bitReader.setBuffer(nal + 4, end);
                    extType = bitReader.getBits<uint8_t>(4);
                    if (extType == SEQUENCE_EXT)
                    {
                        m_sequence.deserializeExtension(bitReader);
                    }
                    else if (extType == PICTURE_CODING_EXT)
                    {
                        frame.deserializeCodingExtension(bitReader);
                        pulldownFound |= frame.repeat_first_field > 0;
                    }
                    break;
                case SEQ_END_SHORT_CODE:
                case GOP_START_SHORT_CODE:
                case USER_START_SHORT_CODE:
                    break;
                case PICTURE_START_SHORT_CODE:
                    if (frame.deserialize(nal + 4, end - nal - 4) == nullptr)
                        return rez;
                    pictureFound = true;
                    break;
                case SEQ_START_SHORT_CODE:
                    nextNal = MPEGHeader::findNextMarker(nal + 4, end);
                    if (m_sequence.deserialize(nal + 4, nextNal - nal - 4) == nullptr)
                        return rez;
                    m_streamAR = static_cast<VideoAspectRatio>(m_sequence.aspect_ratio_info);
                    spsFound = true;
                    break;
                default:
                    return rez;
                }
        }
        catch (BitStreamException& e)
        {
            (void)e;
            // return rez;
        }
    }
    if (spsFound && pictureFound && sliceFound)
    {
        rez.codecInfo = mpeg2CodecInfo;
        rez.streamDescr = m_sequence.getStreamDescr();
        if (pulldownFound)
            rez.streamDescr += " (pulldown)";
    }
    return rez;
}